

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

char16 * __thiscall
TTD::SlabAllocatorBase<8>::CopyRawNullTerminatedStringInto(SlabAllocatorBase<8> *this,char16 *str)

{
  size_t sVar1;
  size_t sizeInBytes;
  char16 *res;
  size_t byteLength;
  size_t length;
  char16 *str_local;
  SlabAllocatorBase<8> *this_local;
  
  if (str == (char16 *)0x0) {
    this_local = (SlabAllocatorBase<8> *)0x0;
  }
  else {
    sVar1 = PAL_wcslen(str);
    sizeInBytes = (sVar1 + 1) * 2;
    this_local = (SlabAllocatorBase<8> *)SlabAllocateArray<char16_t>(this,sVar1 + 1);
    js_memcpy_s(this_local,sizeInBytes,str,sizeInBytes);
  }
  return (char16 *)this_local;
}

Assistant:

const char16* CopyRawNullTerminatedStringInto(const char16* str)
        {
            if (str == nullptr)
            {
                return nullptr;
            }
            else
            {
                size_t length = wcslen(str) + 1;
                size_t byteLength = length * sizeof(char16);

                char16* res = this->SlabAllocateArray<char16>(length);
                js_memcpy_s(res, byteLength, str, byteLength);

                return res;
            }
        }